

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreModule.c
# Opt level: O2

int init(EVP_PKEY_CTX *ctx)

{
  MCRegisterInfo *MRI;
  
  if ((*(uint *)(ctx + 4) & 0x7fffffef) != 0) {
    return 5;
  }
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  Sparc_init(MRI);
  *(code **)(ctx + 8) = Sparc_printInst;
  *(MCRegisterInfo **)(ctx + 0x10) = MRI;
  *(MCRegisterInfo **)(ctx + 0x20) = MRI;
  *(code **)(ctx + 0x18) = Sparc_getInstruction;
  *(code **)(ctx + 0x50) = Sparc_post_printer;
  *(code **)(ctx + 0x30) = Sparc_reg_name;
  *(code **)(ctx + 0x48) = Sparc_get_insn_id;
  *(code **)(ctx + 0x38) = Sparc_insn_name;
  *(code **)(ctx + 0x40) = Sparc_group_name;
  return 0;
}

Assistant:

static cs_err init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	mri = cs_mem_malloc(sizeof(*mri));

	XCore_init(mri);
	ud->printer = XCore_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = XCore_getInstruction;
	ud->post_printer = XCore_post_printer;

	ud->reg_name = XCore_reg_name;
	ud->insn_id = XCore_get_insn_id;
	ud->insn_name = XCore_insn_name;
	ud->group_name = XCore_group_name;

	return CS_ERR_OK;
}